

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

void __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
          (PersistentStorageJson *this,string *aFileName)

{
  pointer pcVar1;
  string local_48;
  
  (this->super_PersistentStorage)._vptr_PersistentStorage =
       (_func_int **)&PTR__PersistentStorageJson_003aa1b0;
  (this->mFileName)._M_dataplus._M_p = (pointer)&(this->mFileName).field_2;
  pcVar1 = (aFileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFileName,pcVar1,pcVar1 + aFileName->_M_string_length);
  (this->mCache).m_type = null;
  (this->mCache).m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&this->mCache);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&this->mCache);
  (this->mStorageLock).mPlatform = (sem_t *)0x0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"thrcomm_json_storage","");
  ot::os::semaphore::SemaphoreOpen(&local_48,&this->mStorageLock);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

PersistentStorageJson::PersistentStorageJson(std::string const &aFileName)
    : mFileName(aFileName)
    , mStorageLock()
{
    SemaphoreOpen("thrcomm_json_storage", mStorageLock);
}